

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode ssl_connect_init_proxy(connectdata *conn,int sockindex)

{
  ssl_connect_data *psVar1;
  ssl_backend_data *__s;
  undefined3 uVar2;
  ssl_connection_state sVar3;
  ssl_connect_state sVar4;
  undefined4 uVar5;
  Curl_ssl *pCVar6;
  CURLcode CVar7;
  ssl_connect_data *psVar8;
  
  pCVar6 = Curl_ssl;
  CVar7 = CURLE_OK;
  if ((conn->ssl[sockindex].state == ssl_connection_complete) &&
     (conn->proxy_ssl[sockindex].use == false)) {
    if ((Curl_ssl->supports & 0x10) == 0) {
      CVar7 = CURLE_NOT_BUILT_IN;
    }
    else {
      psVar8 = conn->ssl + sockindex;
      __s = conn->proxy_ssl[sockindex].backend;
      conn->proxy_ssl[sockindex].backend = conn->ssl[sockindex].backend;
      uVar2 = *(undefined3 *)&psVar8->field_0x1;
      sVar3 = psVar8->state;
      sVar4 = conn->ssl[sockindex].connecting_state;
      uVar5 = *(undefined4 *)&conn->ssl[sockindex].field_0xc;
      psVar1 = conn->proxy_ssl + sockindex;
      psVar1->use = psVar8->use;
      *(undefined3 *)&psVar1->field_0x1 = uVar2;
      psVar1->state = sVar3;
      conn->proxy_ssl[sockindex].connecting_state = sVar4;
      *(undefined4 *)&conn->proxy_ssl[sockindex].field_0xc = uVar5;
      psVar8->use = false;
      *(undefined3 *)&psVar8->field_0x1 = 0;
      psVar8->state = ssl_connection_none;
      *(undefined8 *)&conn->ssl[sockindex].connecting_state = 0;
      conn->ssl[sockindex].backend = (ssl_backend_data *)0x0;
      CVar7 = CURLE_OK;
      memset(__s,0,pCVar6->sizeof_ssl_backend_data);
      conn->ssl[sockindex].backend = __s;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode
ssl_connect_init_proxy(struct connectdata *conn, int sockindex)
{
  DEBUGASSERT(conn->bits.proxy_ssl_connected[sockindex]);
  if(ssl_connection_complete == conn->ssl[sockindex].state &&
     !conn->proxy_ssl[sockindex].use) {
    struct ssl_backend_data *pbdata;

    if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
      return CURLE_NOT_BUILT_IN;

    /* The pointers to the ssl backend data, which is opaque here, are swapped
       rather than move the contents. */
    pbdata = conn->proxy_ssl[sockindex].backend;
    conn->proxy_ssl[sockindex] = conn->ssl[sockindex];

    memset(&conn->ssl[sockindex], 0, sizeof(conn->ssl[sockindex]));
    memset(pbdata, 0, Curl_ssl->sizeof_ssl_backend_data);

    conn->ssl[sockindex].backend = pbdata;
  }
  return CURLE_OK;
}